

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

StringLocalizationInfo * __thiscall icu_63::LocDataParser::doParse(LocDataParser *this)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  UChar **elem_00;
  UChar ***d;
  LocDataParser *this_00;
  size_t size;
  LocDataParser *local_98;
  UChar ***result;
  int32_t numLocs;
  UBool haveComma;
  UChar **elem;
  int32_t requiredLength;
  UBool mightHaveNext;
  VArray array;
  LocDataParser *this_local;
  
  array.deleter = (Fn_Deleter)this;
  skipWhitespace(this);
  UVar2 = checkInc(this,L'<');
  if (UVar2 == '\0') {
    parseError(this,(char *)0x0);
    this_local = (LocDataParser *)0x0;
  }
  else {
    VArray::VArray((VArray *)&requiredLength,DeleteFn);
    elem._7_1_ = '\x01';
    elem._0_4_ = -1;
    do {
      while( true ) {
        if (elem._7_1_ == '\0') {
          skipWhitespace(this);
          UVar2 = checkInc(this,L'>');
          if (UVar2 == '\0') {
            UVar2 = check(this,L'<');
            if (UVar2 == '\0') {
              parseError(this,(char *)0x0);
              this_local = (LocDataParser *)0x0;
              bVar1 = true;
            }
            else {
              parseError(this,(char *)0x0);
              this_local = (LocDataParser *)0x0;
              bVar1 = true;
            }
          }
          else {
            skipWhitespace(this);
            if (this->p == this->e) {
              size = 0;
              VArray::add((VArray *)&requiredLength,(void *)0x0,this->ec);
              UVar2 = ::U_SUCCESS(*this->ec);
              if (UVar2 == '\0') {
                bVar1 = false;
              }
              else {
                iVar3 = VArray::length((VArray *)&requiredLength);
                d = (UChar ***)VArray::release((VArray *)&requiredLength);
                this_00 = (LocDataParser *)UMemory::operator_new((UMemory *)0x28,size);
                local_98 = (LocDataParser *)0x0;
                if (this_00 != (LocDataParser *)0x0) {
                  StringLocalizationInfo::StringLocalizationInfo
                            ((StringLocalizationInfo *)this_00,this->data,d,(int)elem + -2,
                             iVar3 + -2);
                  local_98 = this_00;
                }
                this_local = local_98;
                bVar1 = true;
              }
            }
            else {
              parseError(this,(char *)0x0);
              this_local = (LocDataParser *)0x0;
              bVar1 = true;
            }
          }
          goto LAB_0026c4ef;
        }
        elem._7_1_ = '\0';
        elem_00 = nextArray(this,(int32_t *)&elem);
        skipWhitespace(this);
        UVar2 = check(this,L',');
        if (elem_00 == (UChar **)0x0) break;
        VArray::add((VArray *)&requiredLength,elem_00,this->ec);
        if (UVar2 != '\0') {
          inc(this);
          elem._7_1_ = '\x01';
        }
      }
    } while (UVar2 == '\0');
    parseError(this,(char *)0x0);
    this_local = (LocDataParser *)0x0;
    bVar1 = true;
LAB_0026c4ef:
    VArray::~VArray((VArray *)&requiredLength);
    if (!bVar1) {
      parseError(this,(char *)0x0);
      this_local = (LocDataParser *)0x0;
    }
  }
  return (StringLocalizationInfo *)this_local;
}

Assistant:

StringLocalizationInfo*
LocDataParser::doParse(void) {
    skipWhitespace();
    if (!checkInc(OPEN_ANGLE)) {
        ERROR("Missing open angle");
    } else {
        VArray array(DeleteFn);
        UBool mightHaveNext = TRUE;
        int32_t requiredLength = -1;
        while (mightHaveNext) {
            mightHaveNext = FALSE;
            UChar** elem = nextArray(requiredLength);
            skipWhitespace();
            UBool haveComma = check(COMMA);
            if (elem) {
                array.add(elem, ec);
                if (haveComma) {
                    inc();
                    mightHaveNext = TRUE;
                }
            } else if (haveComma) {
                ERROR("Unexpected character");
            }
        }

        skipWhitespace();
        if (!checkInc(CLOSE_ANGLE)) {
            if (check(OPEN_ANGLE)) {
                ERROR("Missing comma in outer array");
            } else {
                ERROR("Missing close angle bracket in outer array");
            }
        }

        skipWhitespace();
        if (p != e) {
            ERROR("Extra text after close of localization data");
        }

        array.add(NULL, ec);
        if (U_SUCCESS(ec)) {
            int32_t numLocs = array.length() - 2; // subtract first, NULL
            UChar*** result = (UChar***)array.release();
            
            return new StringLocalizationInfo(data, result, requiredLength-2, numLocs); // subtract first, NULL
        }
    }
  
    ERROR("Unknown error");
}